

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles3::Functional::FragCoordWCase::iterate(FragCoordWCase *this)

{
  int height;
  int iVar1;
  RenderContext *pRVar2;
  FragCoordWCase *pFVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar7;
  TestError *this_00;
  char *description;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  RGBA threshold;
  Surface refImg;
  Surface testImg;
  deUint16 indices [6];
  float positions [16];
  ProgramSources sources;
  ShaderProgram program;
  RGBA local_2c0;
  RGBA local_2bc;
  Surface local_2b8;
  undefined1 local_2a0 [8];
  char *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined4 local_278;
  FragCoordWCase *local_270;
  TestLog *local_268;
  Surface local_260;
  TextureFormat local_248;
  long local_240;
  long local_238 [2];
  undefined8 local_228;
  undefined4 local_220;
  value_type local_218;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  pointer pbStack_198;
  int local_190;
  value_type *local_188;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  
  local_268 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar7->m_width;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = pRVar7->m_height;
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = (pRVar7->m_pixelFormat).alphaBits;
  bVar10 = 8 - (char)(pRVar7->m_pixelFormat).redBits;
  uVar6 = 0;
  if (0 < iVar1) {
    uVar6 = 0x1000000 << (8U - (char)iVar1 & 0x1f);
  }
  uVar13 = 0x100 << (8U - (char)(pRVar7->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar10 & 0x1f);
  uVar6 = 0x10000 << (8U - (char)(pRVar7->m_pixelFormat).blueBits & 0x1f) | uVar13 | uVar6;
  uVar12 = 1 << (bVar10 & 0x1f) & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar13 = uVar13 >> 8 & 0xff;
  if (0xfd < uVar13) {
    uVar13 = 0xfe;
  }
  uVar11 = uVar6 >> 0x10 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar6 = uVar6 >> 0x18;
  if (0xfd < uVar6) {
    uVar6 = 0xfe;
  }
  local_2bc.m_value = uVar6 * 0x1000000 + (uVar11 << 0x10 | uVar13 << 8 | uVar12) + 0x1010101;
  tcu::Surface::Surface(&local_260,iVar8,height);
  tcu::Surface::Surface(&local_2b8,iVar8,height);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_270 = this;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,"");
  local_2a0 = (undefined1  [8])&local_290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n}\n"
             ,"");
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0,&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,(value_type *)local_2a0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if (local_2a0 != (undefined1  [8])&local_290) {
    operator_delete((void *)local_2a0,local_290._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(local_268,&local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    local_1e8 = 0xbf8000003f800000;
    uStack_1e0 = 0x3f80000000000000;
    local_1f8 = 0x3f99999a3f99999a;
    uStack_1f0 = 0x3f99999a00000000;
    local_218.field_2._M_allocated_capacity = 0xc0000000c0000000;
    local_218.field_2._8_8_ = 0x4000000000000000;
    local_218._M_dataplus._M_p = (pointer)0x3fd9999abfd9999a;
    local_218._M_string_length._0_4_ = 0;
    local_218._M_string_length._4_4_ = 0x3fd9999a;
    local_228 = 0x2000200010000;
    local_220 = 0x30001;
    local_248 = (TextureFormat)local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"a_position","");
    local_2a0._0_4_ = A;
    local_298 = local_290._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_248,local_240 + (long)local_248);
    local_278 = 0;
    local_1d0._0_4_ = local_2a0._0_4_;
    local_1c8._M_p = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_298,local_298 + local_290._M_allocated_capacity);
    local_1b8.field_2._M_allocated_capacity._0_4_ = local_278;
    local_1b8.field_2._8_8_ = 8;
    pbStack_198 = (pointer)0x400000004;
    local_190 = 0;
    local_188 = &local_218;
    if (local_298 != local_290._M_local_buf + 8) {
      operator_delete(local_298,local_290._8_8_ + 1);
    }
    if (local_248 != (TextureFormat)local_238) {
      operator_delete((void *)local_248,local_238[0] + 1);
    }
    (**(code **)(CONCAT44(extraout_var,iVar5) + 0x1680))(local_100.m_program.m_program);
    pFVar3 = local_270;
    local_2a0._0_4_ = R;
    local_2a0._4_4_ = UNORM_INT32;
    local_298 = (char *)CONCAT44(local_298._4_4_,1);
    local_290._M_allocated_capacity = (size_type)&local_228;
    glu::draw(((local_270->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
              (VertexArrayBinding *)local_1d0,(PrimitiveList *)local_2a0,(DrawUtilCallback *)0x0);
    pRVar2 = ((pFVar3->super_TestCase).m_context)->m_renderCtx;
    local_248.order = RGBA;
    local_248.type = UNORM_INT8;
    if ((void *)local_260.m_pixels.m_cap != (void *)0x0) {
      local_260.m_pixels.m_cap = (size_t)local_260.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2a0,&local_248,local_260.m_width,local_260.m_height,1,
               (void *)local_260.m_pixels.m_cap);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_2a0);
    err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
    glu::checkError(err,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x1ba);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8._M_p !=
        &local_1b8) {
      operator_delete(local_1c8._M_p,(ulong)(local_1b8._M_dataplus._M_p + 1));
    }
    if (0 < local_2b8.m_height) {
      uVar6 = 0;
      do {
        if (0 < local_2b8.m_width) {
          iVar8 = 0;
          do {
            fVar15 = ((float)iVar8 + 0.5) / (float)local_2b8.m_width;
            fVar16 = ((float)(int)(local_2b8.m_height + ~uVar6) + 0.5) / (float)local_2b8.m_height;
            fVar14 = 1.0 - fVar15;
            if (1.0 <= fVar15 + fVar16) {
              fVar16 = 1.0 - fVar16;
              fVar15 = (1.0 - fVar14) - fVar16;
              fVar14 = ((fVar14 + fVar14) * 0.5 + (fVar16 * 1.2) / 1.2 + fVar15) /
                       (fVar14 * 0.5 + fVar16 / 1.2 + fVar15);
            }
            else {
              fVar14 = ((fVar15 * 1.2) / 1.2 +
                       (fVar16 + fVar16) * 0.5 + ((fVar14 - fVar16) * 1.7) / 1.7) /
                       (fVar15 / 1.2 + fVar16 * 0.5 + (fVar14 - fVar16) / 1.7);
            }
            local_1d0 = (undefined1  [8])((ulong)(uint)(fVar14 + -1.0) << 0x20);
            local_1c8._M_p = (pointer)0x3f80000000000000;
            tcu::RGBA::RGBA(&local_2c0,(Vec4 *)local_1d0);
            *(deUint32 *)
             ((long)local_2b8.m_pixels.m_ptr + (long)(int)(local_2b8.m_width * uVar6 + iVar8) * 4) =
                 local_2c0.m_value;
            iVar8 = iVar8 + 1;
          } while (iVar8 < local_2b8.m_width);
        }
        uVar6 = uVar6 + 1;
      } while ((int)uVar6 < local_2b8.m_height);
    }
    bVar4 = tcu::pixelThresholdCompare
                      (local_268,"Result","Image comparison result",&local_2b8,&local_260,&local_2bc
                       ,COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar4) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_270->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,
               description);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    tcu::Surface::~Surface(&local_2b8);
    tcu::Surface::~Surface(&local_260);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_1d0 = (undefined1  [8])local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Compile failed","");
  tcu::TestError::TestError(this_00,(string *)local_1d0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const float				w[4]		= { 1.7f, 2.0f, 1.2f, 1.0f };

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-w[0],  w[0], 0.0f, w[0],
				-w[1], -w[1], 0.0f, w[1],
				 w[2],  w[2], 0.0f, w[2],
				 w[3], -w[3], 0.0f, w[3]
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			oow			= ((xf + yf) < 1.0f)
												? projectedTriInterpolate(tcu::Vec3(w[0], w[1], w[2]), tcu::Vec3(w[0], w[1], w[2]), xf, yf)
												: projectedTriInterpolate(tcu::Vec3(w[3], w[2], w[1]), tcu::Vec3(w[3], w[2], w[1]), 1.0f-xf, 1.0f-yf);
				const tcu::Vec4		color		(0.0f, oow - 1.0f, 0.0f, 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}